

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

Edge * __thiscall S2Polygon::Shape::chain_edge(Edge *__return_storage_ptr__,Shape *this,int i,int j)

{
  int iVar1;
  int iVar2;
  S2Loop *pSVar3;
  ostream *poVar4;
  S2Polygon *pSVar5;
  S2Point *_v0;
  S2Point *_v1;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  int local_18;
  int local_14;
  int j_local;
  int i_local;
  Shape *this_local;
  
  local_18 = j;
  local_14 = i;
  _j_local = this;
  iVar1 = num_chains(this);
  local_31 = 0;
  if (iVar1 <= i) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
               ,0x5ff,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar4 = S2LogMessage::stream(&local_30);
    poVar4 = std::operator<<(poVar4,"Check failed: (i) < (Shape::num_chains()) ");
    S2LogMessageVoidify::operator&(&local_19,poVar4);
  }
  iVar1 = local_18;
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  pSVar3 = S2Polygon::loop(this->polygon_,local_14);
  iVar2 = S2Loop::num_vertices(pSVar3);
  if (iVar2 <= iVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
               ,0x600,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_58);
    poVar4 = std::operator<<(poVar4,"Check failed: (j) < (polygon_->loop(i)->num_vertices()) ");
    S2LogMessageVoidify::operator&(local_45,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  pSVar5 = polygon(this);
  pSVar3 = S2Polygon::loop(pSVar5,local_14);
  _v0 = S2Loop::oriented_vertex(pSVar3,local_18);
  pSVar5 = polygon(this);
  pSVar3 = S2Polygon::loop(pSVar5,local_14);
  _v1 = S2Loop::oriented_vertex(pSVar3,local_18 + 1);
  S2Shape::Edge::Edge(__return_storage_ptr__,_v0,_v1);
  return __return_storage_ptr__;
}

Assistant:

S2Shape::Edge S2Polygon::Shape::chain_edge(int i, int j) const {
  S2_DCHECK_LT(i, Shape::num_chains());
  S2_DCHECK_LT(j, polygon_->loop(i)->num_vertices());
  return Edge(polygon()->loop(i)->oriented_vertex(j),
              polygon()->loop(i)->oriented_vertex(j + 1));
}